

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

void __thiscall MatroskaDemuxer::readClose(MatroskaDemuxer *this)

{
  value_type pAVar1;
  Track *pTVar2;
  bool bVar3;
  reference ppAVar4;
  int local_1c;
  int i;
  AVPacket *pkt;
  MatroskaDemuxer *this_local;
  
  if (this->writing_app != (char *)0x0) {
    operator_delete__(this->writing_app);
  }
  if (this->muxing_app != (char *)0x0) {
    operator_delete__(this->muxing_app);
  }
  while (bVar3 = std::queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_>::empty
                           (&this->packets), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppAVar4 = std::queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_>::front
                        (&this->packets);
    pAVar1 = *ppAVar4;
    if (pAVar1->data != (uint8_t *)0x0) {
      operator_delete__(pAVar1->data);
    }
    if (pAVar1 != (value_type)0x0) {
      operator_delete(pAVar1,0x50);
    }
    std::queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_>::pop
              (&this->packets);
  }
  for (local_1c = 0; local_1c < (this->super_IOContextDemuxer).num_tracks; local_1c = local_1c + 1)
  {
    pTVar2 = (this->super_IOContextDemuxer).tracks[local_1c];
    if (pTVar2 != (Track *)0x0) {
      operator_delete__(pTVar2);
    }
  }
  return;
}

Assistant:

void MatroskaDemuxer::readClose()
{
    delete[] writing_app;
    delete[] muxing_app;
    while (!packets.empty())
    {
        const AVPacket *pkt = packets.front();
        delete[] pkt->data;
        delete pkt;
        packets.pop();
    }
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
}